

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O3

void Aig_ObjPrintVerilog(FILE *pFile,Aig_Obj_t *pObj,Vec_Vec_t *vLevels,int Level)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  void *pvVar5;
  long lVar6;
  Aig_Obj_t *pAVar7;
  char *pcVar8;
  uint uVar9;
  int Level_00;
  char *__s;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  Aig_Obj_t *local_40;
  Aig_Obj_t *local_38;
  
  uVar9 = (uint)pObj;
  pAVar7 = (Aig_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  uVar1 = (uint)*(undefined8 *)&pAVar7->field_0x18 & 7;
  if (uVar1 == 6) {
    iVar2 = vLevels->nSize;
    Level_00 = Level + 1;
    if (iVar2 <= Level) {
      if (vLevels->nCap <= Level) {
        if (vLevels->pArray == (void **)0x0) {
          ppvVar4 = (void **)malloc((long)Level_00 << 3);
        }
        else {
          ppvVar4 = (void **)realloc(vLevels->pArray,(long)Level_00 << 3);
          iVar2 = vLevels->nSize;
        }
        vLevels->pArray = ppvVar4;
        vLevels->nCap = Level_00;
      }
      if (iVar2 <= Level) {
        lVar6 = (long)iVar2;
        iVar2 = (Level - iVar2) + 1;
        do {
          pvVar5 = calloc(1,0x10);
          vLevels->pArray[lVar6] = pvVar5;
          lVar6 = lVar6 + 1;
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      vLevels->nSize = Level_00;
      iVar2 = Level_00;
    }
    if ((Level < 0) || (iVar2 <= Level)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                    ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
    }
    pVVar3 = (Vec_Ptr_t *)vLevels->pArray[(uint)Level];
    Aig_ObjCollectMulti(pAVar7,pVVar3);
    pcVar8 = "(";
    if (Level == 0) {
      pcVar8 = "";
    }
    fputs(pcVar8,(FILE *)pFile);
    if (0 < pVVar3->nSize) {
      lVar6 = 0;
      do {
        Aig_ObjPrintVerilog(pFile,(Aig_Obj_t *)
                                  ((ulong)(lVar6 == 0 & (byte)(uVar9 & 1)) ^
                                  (ulong)pVVar3->pArray[lVar6]),vLevels,Level_00);
        iVar2 = pVVar3->nSize;
        if (lVar6 < (long)iVar2 + -1) {
          fwrite(" ^ ",3,1,(FILE *)pFile);
          iVar2 = pVVar3->nSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar2);
    }
  }
  else {
    if (uVar1 == 2) {
      pcVar8 = "~";
      if (((ulong)pObj & 1) == 0) {
        pcVar8 = "";
      }
      fprintf((FILE *)pFile,"%s%s",pcVar8,(pAVar7->field_5).pData);
      return;
    }
    if (uVar1 == 1) {
      fprintf((FILE *)pFile,"1\'b%d",(ulong)(uVar9 & 1 ^ 1));
      return;
    }
    iVar2 = Aig_ObjIsMuxType(pAVar7);
    if (iVar2 != 0) {
      iVar2 = Aig_ObjRecognizeExor(pAVar7,&local_38,&local_40);
      if (iVar2 == 0) {
        pAVar7 = Aig_ObjRecognizeMux(pAVar7,&local_40,&local_38);
        pcVar8 = "(";
        if (Level == 0) {
          pcVar8 = "";
        }
        __s = ")";
        if (Level == 0) {
          __s = "";
        }
        fputs(pcVar8,(FILE *)pFile);
        iVar2 = Level + 1;
        Aig_ObjPrintVerilog(pFile,pAVar7,vLevels,iVar2);
        fwrite(" ? ",3,1,(FILE *)pFile);
        Aig_ObjPrintVerilog(pFile,(Aig_Obj_t *)((ulong)local_40 ^ (ulong)(uVar9 & 1)),vLevels,iVar2)
        ;
        fwrite(" : ",3,1,(FILE *)pFile);
        Aig_ObjPrintVerilog(pFile,(Aig_Obj_t *)((ulong)(uVar9 & 1) ^ (ulong)local_38),vLevels,iVar2)
        ;
      }
      else {
        pcVar8 = "(";
        if (Level == 0) {
          pcVar8 = "";
        }
        __s = ")";
        if (Level == 0) {
          __s = "";
        }
        fputs(pcVar8,(FILE *)pFile);
        Aig_ObjPrintVerilog(pFile,(Aig_Obj_t *)((ulong)(uVar9 & 1) ^ (ulong)local_38),vLevels,
                            Level + 1);
        fwrite(" ^ ",3,1,(FILE *)pFile);
        Aig_ObjPrintVerilog(pFile,local_40,vLevels,Level + 1);
      }
      goto LAB_006dd33d;
    }
    Vec_VecExpand(vLevels,Level);
    pVVar3 = Vec_VecEntry(vLevels,Level);
    Aig_ObjCollectMulti(pAVar7,pVVar3);
    pcVar8 = "(";
    if (Level == 0) {
      pcVar8 = "";
    }
    fputs(pcVar8,(FILE *)pFile);
    if (0 < pVVar3->nSize) {
      pcVar8 = "|";
      if (((ulong)pObj & 1) == 0) {
        pcVar8 = "&";
      }
      lVar6 = 0;
      do {
        Aig_ObjPrintVerilog(pFile,(Aig_Obj_t *)((ulong)pVVar3->pArray[lVar6] ^ (ulong)(uVar9 & 1)),
                            vLevels,Level + 1);
        iVar2 = pVVar3->nSize;
        if (lVar6 < (long)iVar2 + -1) {
          fprintf((FILE *)pFile," %s ",pcVar8);
          iVar2 = pVVar3->nSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar2);
    }
  }
  __s = ")";
  if (Level == 0) {
    __s = "";
  }
LAB_006dd33d:
  fputs(__s,(FILE *)pFile);
  return;
}

Assistant:

void Aig_ObjPrintVerilog( FILE * pFile, Aig_Obj_t * pObj, Vec_Vec_t * vLevels, int Level )
{
    Vec_Ptr_t * vSuper;
    Aig_Obj_t * pFanin, * pFanin0, * pFanin1, * pFaninC;
    int fCompl, i;
    // store the complemented attribute
    fCompl = Aig_IsComplement(pObj);
    pObj = Aig_Regular(pObj);
    // constant case
    if ( Aig_ObjIsConst1(pObj) )
    {
        fprintf( pFile, "1\'b%d", !fCompl );
        return;
    }
    // PI case
    if ( Aig_ObjIsCi(pObj) )
    {
        fprintf( pFile, "%s%s", fCompl? "~" : "", (char*)pObj->pData );
        return;
    }
    // EXOR case
    if ( Aig_ObjIsExor(pObj) )
    {
        Vec_VecExpand( vLevels, Level );
        vSuper = Vec_VecEntry( vLevels, Level );
        Aig_ObjCollectMulti( pObj, vSuper );
        fprintf( pFile, "%s", (Level==0? "" : "(") );
        Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
        {
            Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin, (fCompl && i==0)), vLevels, Level+1 );
            if ( i < Vec_PtrSize(vSuper) - 1 )
                fprintf( pFile, " ^ " );
        }
        fprintf( pFile, "%s", (Level==0? "" : ")") );
        return;
    }
    // MUX case
    if ( Aig_ObjIsMuxType(pObj) )
    {
        if ( Aig_ObjRecognizeExor( pObj, &pFanin0, &pFanin1 ) )
        {
            fprintf( pFile, "%s", (Level==0? "" : "(") );
            Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin0, fCompl), vLevels, Level+1 );
            fprintf( pFile, " ^ " );
            Aig_ObjPrintVerilog( pFile, pFanin1, vLevels, Level+1 );
            fprintf( pFile, "%s", (Level==0? "" : ")") );
        }
        else 
        {
            pFaninC = Aig_ObjRecognizeMux( pObj, &pFanin1, &pFanin0 );
            fprintf( pFile, "%s", (Level==0? "" : "(") );
            Aig_ObjPrintVerilog( pFile, pFaninC, vLevels, Level+1 );
            fprintf( pFile, " ? " );
            Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin1, fCompl), vLevels, Level+1 );
            fprintf( pFile, " : " );
            Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin0, fCompl), vLevels, Level+1 );
            fprintf( pFile, "%s", (Level==0? "" : ")") );
        }
        return;
    }
    // AND case
    Vec_VecExpand( vLevels, Level );
    vSuper = Vec_VecEntry(vLevels, Level);
    Aig_ObjCollectMulti( pObj, vSuper );
    fprintf( pFile, "%s", (Level==0? "" : "(") );
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pFanin, i )
    {
        Aig_ObjPrintVerilog( pFile, Aig_NotCond(pFanin, fCompl), vLevels, Level+1 );
        if ( i < Vec_PtrSize(vSuper) - 1 )
            fprintf( pFile, " %s ", fCompl? "|" : "&" );
    }
    fprintf( pFile, "%s", (Level==0? "" : ")") );
    return;
}